

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  MessageLite *pMVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar3;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_28,&local_30);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    pMVar2 = internal::ExtensionSet::GetRepeatedMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),
                        index);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi(field);
    if (bVar1) {
      this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      pRVar3 = internal::MapFieldBase::GetRepeatedField(this_00);
    }
    else {
      pRVar3 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    pMVar2 = (MessageLite *)pRVar3->rep_->elements[index];
  }
  return (Message *)pMVar2;
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}